

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qfbscreen_p.cpp
# Opt level: O3

void QFbScreen::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 uVar1;
  
  if (_c == InvokeMetaMethod) {
    if (_id == 2) {
      setGeometry((QFbScreen *)_o,(QRect *)_a[1]);
      return;
    }
    if (_id == 1) {
      uVar1 = *_a[1];
      *(double *)(_o + 0x68) = (double)(int)uVar1;
      *(double *)(_o + 0x70) = (double)(int)((ulong)uVar1 >> 0x20);
      return;
    }
    if (_id == 0) {
      (**(code **)(*(long *)_o + 0xd0))(_o,_a[1]);
      return;
    }
  }
  return;
}

Assistant:

void QFbScreen::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QFbScreen *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->setDirty((*reinterpret_cast< std::add_pointer_t<QRect>>(_a[1]))); break;
        case 1: _t->setPhysicalSize((*reinterpret_cast< std::add_pointer_t<QSize>>(_a[1]))); break;
        case 2: _t->setGeometry((*reinterpret_cast< std::add_pointer_t<QRect>>(_a[1]))); break;
        default: ;
        }
    }
}